

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

void Acec_CheckBoothPPs(Gia_Man_t *p,Vec_Wec_t *vLitLeaves)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  uint local_40;
  uint local_3c;
  int CountNB;
  int CountB;
  int CountPI;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Bit_t *vMarked;
  Vec_Wec_t *vLitLeaves_local;
  Gia_Man_t *p_local;
  
  p_00 = Acec_MultMarkPPs(p);
  for (iLit = 0; iVar1 = Vec_WecSize(vLitLeaves), iLit < iVar1; iLit = iLit + 1) {
    p_01 = Vec_WecEntry(vLitLeaves,iLit);
    CountNB = 0;
    local_3c = 0;
    local_40 = 0;
    for (CountPI = 0; iVar1 = Vec_IntSize(p_01), CountPI < iVar1; CountPI = CountPI + 1) {
      iVar1 = Vec_IntEntry(p_01,CountPI);
      iVar2 = Abc_Lit2Var(iVar1);
      pObj = Gia_ManObj(p,iVar2);
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        CountNB = CountNB + 1;
      }
      else {
        iVar1 = Abc_Lit2Var(iVar1);
        iVar1 = Vec_BitEntry(p_00,iVar1);
        if (iVar1 == 0) {
          local_40 = local_40 + 1;
        }
        else {
          local_3c = local_3c + 1;
        }
      }
    }
    uVar3 = Vec_IntSize(p_01);
    printf("Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n",(ulong)(uint)iLit,
           (ulong)uVar3,(ulong)(uint)CountNB,(ulong)local_3c,(ulong)local_40);
  }
  Vec_BitFree(p_00);
  return;
}

Assistant:

void Acec_CheckBoothPPs( Gia_Man_t * p, Vec_Wec_t * vLitLeaves )
{
    Vec_Bit_t * vMarked = Acec_MultMarkPPs( p );
    Vec_Int_t * vLevel;
    int i, k, iLit;
    Vec_WecForEachLevel( vLitLeaves, vLevel, i )
    {
        int CountPI = 0, CountB = 0, CountNB = 0;
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                CountPI++;
            else if ( Vec_BitEntry( vMarked, Abc_Lit2Var(iLit) ) )
                CountB++;
            else
                CountNB++;

        printf( "Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n", i, Vec_IntSize(vLevel), CountPI, CountB, CountNB );
    }
    Vec_BitFree( vMarked );
}